

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

bool fs_is_subdir(string_view subdir,string_view dir)

{
  string_view in;
  string_view in_00;
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a8;
  undefined8 local_98;
  size_t sStack_90;
  undefined1 local_88 [8];
  string d;
  undefined1 local_50 [8];
  string s;
  string_view dir_local;
  string_view subdir_local;
  
  dir_local._M_len = (size_t)dir._M_str;
  s.field_2._8_8_ = dir._M_len;
  dir_local._M_str = (char *)subdir._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dir_local._M_str);
  if ((!bVar1) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)((long)&s.field_2 + 8))
     , !bVar1)) {
    d.field_2._8_8_ = dir_local._M_str;
    in_00._M_str = subdir._M_str;
    in_00._M_len = (size_t)dir_local._M_str;
    fs_drop_slash_abi_cxx11_((string *)local_50,in_00);
    local_98 = s.field_2._8_8_;
    sStack_90 = dir_local._M_len;
    in._M_str = (char *)dir_local._M_len;
    in._M_len = s.field_2._8_8_;
    fs_drop_slash_abi_cxx11_((string *)local_88,in);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_88);
    if (_Var2) {
      subdir_local._M_str._7_1_ = false;
    }
    else {
      uVar3 = std::__cxx11::string::size();
      uVar4 = std::__cxx11::string::size();
      if (uVar3 < uVar4) {
        subdir_local._M_str._7_1_ = false;
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_50);
        subdir_local._M_str._7_1_ =
             std::operator==(&local_c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
    local_a8 = 1;
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_50);
    return subdir_local._M_str._7_1_;
  }
  return false;
}

Assistant:

bool
fs_is_subdir(std::string_view subdir, std::string_view dir)
{
  // is subdir a subdirectory of dir. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(subdir.empty() || dir.empty())
    return false;

  std::string const s = fs_drop_slash(subdir);
  std::string const d = fs_drop_slash(dir);

  if(s == d)
    return false;

  if(s.size() < d.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return s.starts_with(d);
#else
  return s.substr(0, d.size()) == d;
#endif

}